

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall
kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper(BufferedInputStreamWrapper *this)

{
  ~BufferedInputStreamWrapper(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

BufferedInputStreamWrapper::~BufferedInputStreamWrapper() noexcept(false) {}